

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music.c
# Opt level: O0

void awaken_monsters(int distance)

{
  int iVar1;
  monst *pmStack_18;
  int distm;
  monst *mtmp;
  int distance_local;
  
  for (pmStack_18 = level->monlist; pmStack_18 != (monst *)0x0; pmStack_18 = pmStack_18->nmon) {
    if ((0 < pmStack_18->mhp) &&
       (iVar1 = dist2((int)pmStack_18->mx,(int)pmStack_18->my,(int)u.ux,(int)u.uy), iVar1 < distance
       )) {
      *(uint *)&pmStack_18->field_0x60 = *(uint *)&pmStack_18->field_0x60 & 0xfff7ffff;
      *(uint *)&pmStack_18->field_0x60 = *(uint *)&pmStack_18->field_0x60 & 0xfffbffff | 0x40000;
      pmStack_18->mfrozen = '\0';
      if ((iVar1 < distance / 3) && (iVar1 = resist(pmStack_18,'\x06',0,0), iVar1 == 0)) {
        monflee(pmStack_18,0,'\0','\x01');
      }
    }
  }
  return;
}

Assistant:

static void awaken_monsters(int distance)
{
	struct monst *mtmp = level->monlist;
	int distm;

	while (mtmp) {
	    if (!DEADMONSTER(mtmp)) {
		distm = distu(mtmp->mx, mtmp->my);
		if (distm < distance) {
		    mtmp->msleeping = 0;
		    mtmp->mcanmove = 1;
		    mtmp->mfrozen = 0;
		    /* May scare some monsters */
		    if (distm < distance/3 &&
			    !resist(mtmp, TOOL_CLASS, 0, NOTELL))
			monflee(mtmp, 0, FALSE, TRUE);
		}
	    }
	    mtmp = mtmp->nmon;
	}
}